

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger.hpp
# Opt level: O1

void __thiscall LoaderLogger::~LoaderLogger(LoaderLogger *this)

{
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            (&(this->data_).object_info_.object_info_);
  std::
  _Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>,_std::allocator<std::pair<XrSession_T_*const,_std::unique_ptr<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>,_std::allocator<std::unique_ptr<XrSdkSessionLabel,_std::default_delete<XrSdkSessionLabel>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&this->data_);
  std::
  _Hashtable<XrInstance_T_*,_std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<XrInstance_T_*const,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<XrInstance_T_*>,_std::hash<XrInstance_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->_recordersByInstance)._M_h);
  std::
  vector<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>,_std::allocator<std::unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>_>_>
  ::~vector(&this->_recorders);
  return;
}

Assistant:

static LoaderLogger& GetInstance() {
        static LoaderLogger instance;
        return instance;
    }